

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O1

vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> * __thiscall
tandem::detail::extract_exact_tandem_repeats_lz<std::__cxx11::string>
          (vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *__return_storage_ptr__,
          detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          uint32_t min_period,uint32_t max_period)

{
  pointer pRVar1;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *pvVar2;
  size_type_conflict __n;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *bucket;
  pointer __c;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  sorted_buckets;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  local_30;
  
  extract_maximal_repetitions<std::__cxx11::string>(&local_30,this,str,min_period,max_period);
  (__return_storage_ptr__->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = 0;
  for (pvVar2 = local_30.
                super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 != local_30.
                super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar2 = pvVar2 + 1) {
    __n = __n + ((long)(pvVar2->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar2->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  }
  std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::reserve(__return_storage_ptr__,__n);
  for (__c = local_30.
             super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __c != local_30.
             super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __c = __c + 1) {
    std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<tandem::Repeat_const*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>>
              ((vector<tandem::Repeat,std::allocator<tandem::Repeat>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    pRVar1 = (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pRVar1) {
      (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
      super__Vector_impl_data._M_finish = pRVar1;
    }
    if ((__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage !=
        (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_true>::
      _S_do_it(__c);
    }
  }
  std::
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Repeat>
extract_exact_tandem_repeats_lz(const T& str, const std::uint32_t min_period, const std::uint32_t max_period)
{
    auto sorted_buckets = detail::extract_maximal_repetitions(str, min_period, max_period);
    std::vector<Repeat> result {};
    result.reserve(detail::count_runs(sorted_buckets));
    for (auto& bucket : sorted_buckets) {
        result.insert(std::end(result), std::cbegin(bucket), std::cend(bucket));
        bucket.clear();
        bucket.shrink_to_fit();
    }
    return result;
}